

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

void __thiscall
pbrt::LightPathIntegrator::EvaluatePixelSample
          (LightPathIntegrator *this,Point2i pPixel,int sampleIndex,SamplerHandle *sampler,
          ScratchBuffer *scratchBuffer)

{
  float fVar1;
  CameraHandle *this_00;
  long lVar4;
  float *pfVar5;
  float fVar6;
  PowerLightSampler *this_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  LightSampleContext ctx;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Normal3f n;
  Vector3f wiRender;
  ScratchBuffer *scratchBuffer_00;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  bool bVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  PrimitiveHandle *this_02;
  ulong uVar23;
  uint uVar24;
  byte bVar25;
  int iVar26;
  HaltonSampler *pHVar27;
  DebugMLTSampler *pDVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Float FVar31;
  Point2f u;
  float fVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Tuple2<pbrt::Point2,_float> TVar33;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar39 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar40 [64];
  Tuple2<pbrt::Point2,_float> u2;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar41 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined1 auVar49 [56];
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar43 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar44 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar45 [64];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar47 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar48 [64];
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [56];
  Vector3f w;
  Vector3f wi;
  Point3f p;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f wi_00;
  SampledSpectrum SVar57;
  SampledSpectrum a;
  SampledSpectrum v;
  SampledWavelengths lambda;
  optional<pbrt::BSDFSample> bs;
  optional<pbrt::LightLeSample> les;
  optional<pbrt::CameraWiSample> cs;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum Le;
  BSDF bsdf;
  undefined1 local_4f8 [16];
  Float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [16];
  LightHandle local_4a0;
  float local_498;
  float local_494;
  uint local_490;
  uint local_48c;
  Float local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  SampledWavelengths local_478;
  aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> local_458;
  byte local_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  ScratchBuffer *local_410;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_408;
  CameraHandle local_400;
  undefined1 local_3f8 [8];
  float afStack_3f0 [12];
  Interaction local_3c0;
  undefined1 local_370;
  undefined4 local_368;
  undefined4 local_364;
  bool local_360;
  RayDifferential local_358;
  undefined1 local_2f8 [40];
  Interaction local_2d0;
  Interaction local_280;
  undefined1 local_230;
  undefined4 local_200;
  bool local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  aligned_storage_t<sizeof(pbrt::SampledLight),_alignof(pbrt::SampledLight)> local_1b0;
  char local_1a0;
  undefined1 local_198 [8];
  float afStack_190 [6];
  Point2f local_178;
  Interaction local_170;
  Interaction local_120;
  bool local_d0;
  RayDifferential local_c8;
  BSDF local_68;
  float fVar2;
  float fVar3;
  undefined1 auVar42 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  
  local_2f8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar31 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_198,local_2f8,(ulong)local_2f8._0_8_ >> 0x30);
  SampledWavelengths::SampleXYZ
            (&local_478,
             (Float)((uint)(*(byte *)(Options + 6) & 1) * 0x3f000000 +
                    (uint)!(bool)(*(byte *)(Options + 6) & 1) * (int)FVar31));
  local_2f8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  this_01 = (this->lightSampler)._M_t.
            super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
            ._M_t.
            super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>
            .super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl;
  FVar31 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_198,local_2f8,(ulong)local_2f8._0_8_ >> 0x30);
  PowerLightSampler::Sample((optional<pbrt::SampledLight> *)&local_1b0.__align,this_01,FVar31);
  if (local_1a0 != '\x01') {
    return;
  }
  local_4a0.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             )local_1b0.__align;
  this_00 = &(this->super_ImageTileIntegrator).camera;
  local_2f8._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar31 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)local_198,local_2f8,(ulong)local_2f8._0_8_ >> 0x30);
  uVar23 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar22 = (this_00->
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           ).bits & 0xffffffffffff;
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(FVar31 * *(float *)(uVar22 + 0x33c))),
                            ZEXT416((uint)(1.0 - FVar31)),ZEXT416(*(uint *)(uVar22 + 0x338)));
  uVar11 = (ushort)(uVar23 >> 0x30);
  uVar20 = (uint)uVar11;
  if (uVar23 >> 0x30 < 5) {
    if (uVar23 < 0x3000000000000) {
      if (uVar20 == 2) {
        TVar33 = (Tuple2<pbrt::Point2,_float>)
                 StratifiedSampler::Get2D((StratifiedSampler *)(uVar23 & 0xffffffffffff));
      }
      else {
        TVar33 = (Tuple2<pbrt::Point2,_float>)
                 RandomSampler::Get2D((RandomSampler *)(uVar23 & 0xffffffffffff));
      }
    }
    else {
      pHVar27 = (HaltonSampler *)(uVar23 & 0xffffffffffff);
      if ((uVar20 & 6) == 2) {
        iVar26 = 2;
        if (pHVar27->dimension < 999) {
          iVar26 = pHVar27->dimension;
        }
        pHVar27->dimension = iVar26 + 2;
        local_4f8._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar26);
        local_4f8._4_4_ = extraout_XMM0_Db;
        local_4f8._8_4_ = extraout_XMM0_Dc;
        local_4f8._12_4_ = extraout_XMM0_Dd;
        auVar39._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar26 + 1);
        auVar39._4_60_ = extraout_var;
        auVar30 = auVar39._0_16_;
LAB_003c110a:
        auVar30 = vinsertps_avx(local_4f8,auVar30,0x10);
        TVar33 = auVar30._0_8_;
      }
      else {
        TVar33 = (Tuple2<pbrt::Point2,_float>)
                 PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar27);
      }
    }
  }
  else {
    uVar24 = uVar11 - 4;
    if (uVar24 < 3) {
      if (uVar24 == 2) {
        TVar33 = (Tuple2<pbrt::Point2,_float>)
                 ZSobolSampler::Get2D((ZSobolSampler *)(uVar23 & 0xffffffffffff));
      }
      else {
        TVar33 = (Tuple2<pbrt::Point2,_float>)
                 SobolSampler::Get2D((SobolSampler *)(uVar23 & 0xffffffffffff));
      }
    }
    else if (uVar20 - 6 < 2) {
      TVar33 = (Tuple2<pbrt::Point2,_float>)
               PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar23 & 0xffffffffffff));
    }
    else {
      pDVar28 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
      if (uVar20 - 6 != 2) {
        local_4f8._0_4_ = DebugMLTSampler::Get1D(pDVar28);
        local_4f8._4_4_ = extraout_XMM0_Db_00;
        local_4f8._8_4_ = extraout_XMM0_Dc_00;
        local_4f8._12_4_ = extraout_XMM0_Dd_00;
        auVar40._0_4_ = DebugMLTSampler::Get1D(pDVar28);
        auVar40._4_60_ = extraout_var_00;
        auVar30 = auVar40._0_16_;
        goto LAB_003c110a;
      }
      TVar33 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar28);
    }
  }
  uVar23 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar11 = (ushort)(uVar23 >> 0x30);
  uVar20 = (uint)uVar11;
  if (uVar23 < 0x5000000000000) {
    if (uVar23 < 0x3000000000000) {
      if (uVar20 == 2) {
        u2 = (Tuple2<pbrt::Point2,_float>)
             StratifiedSampler::Get2D((StratifiedSampler *)(uVar23 & 0xffffffffffff));
      }
      else {
        u2 = (Tuple2<pbrt::Point2,_float>)
             RandomSampler::Get2D((RandomSampler *)(uVar23 & 0xffffffffffff));
      }
    }
    else {
      pHVar27 = (HaltonSampler *)(uVar23 & 0xffffffffffff);
      if ((uVar20 & 6) == 2) {
        iVar26 = 2;
        if (pHVar27->dimension < 999) {
          iVar26 = pHVar27->dimension;
        }
        pHVar27->dimension = iVar26 + 2;
        local_4c8._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar26);
        local_4c8._4_4_ = extraout_XMM0_Db_01;
        local_4c8._8_4_ = extraout_XMM0_Dc_01;
        local_4c8._12_4_ = extraout_XMM0_Dd_01;
        auVar41._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar26 + 1);
        auVar41._4_60_ = extraout_var_01;
        auVar30 = auVar41._0_16_;
LAB_003c1522:
        auVar30 = vinsertps_avx(local_4c8,auVar30,0x10);
        u2 = auVar30._0_8_;
      }
      else {
        u2 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar27);
      }
    }
  }
  else {
    uVar24 = uVar11 - 4;
    if (uVar24 < 3) {
      if (uVar24 == 2) {
        u2 = (Tuple2<pbrt::Point2,_float>)
             ZSobolSampler::Get2D((ZSobolSampler *)(uVar23 & 0xffffffffffff));
      }
      else {
        u2 = (Tuple2<pbrt::Point2,_float>)
             SobolSampler::Get2D((SobolSampler *)(uVar23 & 0xffffffffffff));
      }
    }
    else {
      pDVar28 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
      if (uVar20 - 6 < 2) {
        u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar28);
      }
      else {
        if (uVar20 - 6 != 2) {
          local_4c8._0_4_ = DebugMLTSampler::Get1D(pDVar28);
          local_4c8._4_4_ = extraout_XMM0_Db_02;
          local_4c8._8_4_ = extraout_XMM0_Dc_02;
          local_4c8._12_4_ = extraout_XMM0_Dd_02;
          auVar43._0_4_ = DebugMLTSampler::Get1D(pDVar28);
          auVar43._4_60_ = extraout_var_02;
          auVar30 = auVar43._0_16_;
          goto LAB_003c1522;
        }
        u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar28);
      }
    }
  }
  LightHandle::SampleLe
            ((optional<pbrt::LightLeSample> *)local_3f8,&local_4a0,(Point2f)TVar33,(Point2f)u2,
             &local_478,auVar29._0_4_);
  if (local_360 != true) {
    return;
  }
  if (((float)local_368 == 0.0) && (!NAN((float)local_368))) {
    return;
  }
  if (((float)local_364 == 0.0) && (!NAN((float)local_364))) {
    return;
  }
  if (((float)local_3f8._0_4_ == 0.0) && (!NAN((float)local_3f8._0_4_))) {
    uVar23 = 0xffffffffffffffff;
    do {
      if (uVar23 == 2) {
        return;
      }
      pfVar5 = afStack_3f0 + uVar23;
      uVar23 = uVar23 + 1;
    } while ((*pfVar5 == 0.0) && (!NAN(*pfVar5)));
    if (2 < uVar23) {
      return;
    }
  }
  if (local_370 == '\x01') {
    u = SamplerHandle::Get2D(sampler);
    CameraHandle::SampleWi
              ((optional<pbrt::CameraWiSample> *)local_2f8,this_00,&local_3c0,u,&local_478);
    if (((bool)local_230 == true) &&
       (((float)local_2f8._28_4_ != 0.0 || (NAN((float)local_2f8._28_4_))))) {
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           high;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           low;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           high;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           low;
      local_1e8._0_4_ =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           low;
      local_1e8._4_4_ =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           high;
      uStack_1d0 = 0;
      uStack_1c0 = 0;
      uStack_1c8 = SUB168(ZEXT816(0),4);
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._20_4_;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._16_4_;
      ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
           local_280.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(undefined4)uStack_1c8;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uStack_1c8._4_4_;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2f8._24_4_;
      FVar31 = LightHandle::PDF_Li(&local_4a0,ctx,wi,WithoutMIS);
      if (0.0 < FVar31) {
        if (((local_360 == true) && (local_370 == '\x01')) && ((bool)local_230 == true)) {
          n.super_Tuple3<pbrt::Normal3,_float>.y = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.y;
          n.super_Tuple3<pbrt::Normal3,_float>.x = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.x;
          n.super_Tuple3<pbrt::Normal3,_float>.z = local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar29 = vinsertps_avx(ZEXT416((uint)((local_3c0.pi.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                                                 local_3c0.pi.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high)
                                                * 0.5)),
                                  ZEXT416((uint)((local_3c0.pi.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
                                                 local_3c0.pi.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                                                * 0.5)),0x10);
          w.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._20_4_;
          w.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._16_4_;
          w.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2f8._24_4_;
          p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar29._0_8_;
          p.super_Tuple3<pbrt::Point3,_float>.z =
               (local_3c0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                .z.low + local_3c0.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
          auVar56 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
          auVar49 = ZEXT856(auVar29._8_8_);
          SVar57 = LightHandle::L(&local_4a0,p,n,local_3c0.uv,w,&local_478);
          auVar54._0_8_ = SVar57.values.values._8_8_;
          auVar54._8_56_ = auVar56;
          auVar42._0_8_ = SVar57.values.values._0_8_;
          auVar42._8_56_ = auVar49;
          _local_198 = vmovlhps_avx(auVar42._0_16_,auVar54._0_16_);
          if ((SVar57.values.values[0] == 0.0) && (!NAN(SVar57.values.values[0]))) {
            uVar23 = 0xffffffffffffffff;
            do {
              if (uVar23 == 2) goto LAB_003c1643;
              lVar4 = uVar23 * 4;
              uVar23 = uVar23 + 1;
            } while ((*(float *)(local_198 + lVar4 + 8) == 0.0) &&
                    (!NAN(*(float *)(local_198 + lVar4 + 8))));
            if (2 < uVar23) goto LAB_003c1643;
          }
          if ((bool)local_230 != false) {
            bVar19 = Integrator::Unoccluded((Integrator *)this,&local_2d0,&local_280);
            if (bVar19) {
              if ((local_360 != true) || ((bool)local_230 == false)) {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
              }
              if (local_370 == '\x01') {
                auVar29 = vfmadd132ss_fma(ZEXT416((uint)local_3c0.n.
                                                        super_Tuple3<pbrt::Normal3,_float>.y),
                                          ZEXT416((uint)(local_3c0.n.
                                                         super_Tuple3<pbrt::Normal3,_float>.z *
                                                        (float)local_2f8._24_4_)),
                                          ZEXT416((uint)local_2f8._20_4_));
                auVar30 = vfmsub213ss_fma(ZEXT416((uint)local_2f8._24_4_),
                                          ZEXT416((uint)local_3c0.n.
                                                        super_Tuple3<pbrt::Normal3,_float>.z),
                                          ZEXT416((uint)(local_3c0.n.
                                                         super_Tuple3<pbrt::Normal3,_float>.z *
                                                        (float)local_2f8._24_4_)));
                auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                          ZEXT416((uint)local_3c0.n.
                                                        super_Tuple3<pbrt::Normal3,_float>.x),
                                          ZEXT416((uint)local_2f8._16_4_));
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar29 = vandps_avx512vl(auVar29,auVar30);
                fVar32 = auVar29._0_4_;
              }
              else {
                fVar32 = 1.0;
              }
              SVar57.values.values[2] = local_478.pdf.values[2];
              SVar57.values.values[3] = local_478.pdf.values[3];
              SVar57.values.values[0] = local_478.pdf.values[0];
              SVar57.values.values[1] = local_478.pdf.values[1];
              auVar29._0_4_ = fVar32 * (float)local_198._0_4_ * (float)local_2f8._0_4_;
              auVar29._4_4_ = fVar32 * (float)local_198._4_4_ * (float)local_2f8._4_4_;
              auVar29._8_4_ = fVar32 * afStack_190[0] * (float)local_2f8._8_4_;
              auVar29._12_4_ = fVar32 * afStack_190[1] * (float)local_2f8._12_4_;
              fVar32 = FVar31 * (float)local_1b0._8_4_ * (float)local_2f8._28_4_;
              auVar36._4_4_ = fVar32;
              auVar36._0_4_ = fVar32;
              auVar36._8_4_ = fVar32;
              auVar36._12_4_ = fVar32;
              auVar29 = vdivps_avx(auVar29,auVar36);
              auVar30 = vshufpd_avx(auVar29,auVar29,1);
              a.values.values._0_8_ = auVar29._0_8_;
              a.values.values._8_8_ = auVar30._0_8_;
              SVar57 = SafeDiv(a,SVar57);
              local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
                   *(undefined8 *)
                    (((this_00->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits & 0xffffffffffff) + 0x340);
              if ((bool)local_230 == false) {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
              }
              FilmHandle::AddSplat
                        ((FilmHandle *)&local_358,(Point2f *)(local_2f8 + 0x20),SVar57,&local_478);
            }
            goto LAB_003c1643;
          }
        }
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
      }
    }
  }
LAB_003c1643:
  if ((local_360 & 1U) == 0) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
  }
  local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = afStack_3f0[7];
  local_358.super_Ray.time = afStack_3f0[8];
  uVar16 = local_358.super_Ray._20_8_;
  local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = afStack_3f0[2];
  local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = afStack_3f0[3];
  local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = afStack_3f0[4];
  local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = afStack_3f0[5];
  local_358.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )afStack_3f0._40_8_;
  local_358._40_4_ = local_358._40_4_ & 0xffffff00;
  local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar32 = 1.0;
  if (local_370 == '\x01') {
    local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)afStack_3f0._28_8_;
    auVar29 = vfmadd132ss_fma(ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.y),
                              ZEXT416((uint)(local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z *
                                            local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                            .z)),ZEXT416((uint)afStack_3f0[6]));
    auVar30 = vfmsub213ss_fma(ZEXT416((uint)local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                            .z),
                              ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z),
                              ZEXT416((uint)(local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.z *
                                            local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                            .z)));
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                              ZEXT416((uint)local_3c0.n.super_Tuple3<pbrt::Normal3,_float>.x),
                              ZEXT416((uint)afStack_3f0[5]));
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx512vl(auVar29,auVar7);
    fVar32 = auVar29._0_4_;
  }
  auVar34._0_4_ = fVar32 * (float)local_3f8._0_4_;
  auVar34._4_4_ = fVar32 * (float)local_3f8._4_4_;
  auVar34._8_4_ = fVar32 * afStack_3f0[0];
  auVar34._12_4_ = fVar32 * afStack_3f0[1];
  iVar26 = 0;
  fVar32 = (float)local_1b0._8_4_ * (float)local_368 * (float)local_364;
  this_02 = &(this->super_ImageTileIntegrator).super_Integrator.aggregate;
  auVar51._4_4_ = fVar32;
  auVar51._0_4_ = fVar32;
  auVar51._8_4_ = fVar32;
  auVar51._12_4_ = fVar32;
  _local_428 = vdivps_avx(auVar34,auVar51);
  local_410 = scratchBuffer;
  local_358.super_Ray._20_8_ = uVar16;
  local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
       local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
  local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
       local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
  do {
    scratchBuffer_00 = local_410;
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (((this_02->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      return;
    }
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)local_2f8,this_02,&local_358.super_Ray,INFINITY)
    ;
    if ((local_1f8 & 1U) == 0) {
      return;
    }
    local_400.
    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
    .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             )(this_00->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
    local_408.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_68,(SurfaceInteraction *)local_2f8,&local_358,&local_478,&local_400,
               scratchBuffer_00,(SamplerHandle *)&local_408);
    uVar18 = local_2f8._36_4_;
    uVar17 = local_2f8._32_4_;
    uVar50 = local_2f8._28_4_;
    if (((ulong)local_68.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) == 0) {
      if (local_1f8 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
      }
      SurfaceInteraction::SkipIntersection
                ((SurfaceInteraction *)local_2f8,&local_358,(Float)local_200);
      bVar25 = 0;
    }
    else {
      iVar21 = iVar26 + 1;
      bVar25 = 1;
      bVar19 = iVar26 != this->maxDepth;
      iVar26 = iVar21;
      if (bVar19) {
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2f8._32_4_;
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2f8._28_4_;
        uVar23 = (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        uVar11 = (ushort)(uVar23 >> 0x30);
        uVar20 = (uint)uVar11;
        if (uVar23 < 0x5000000000000) {
          if (uVar23 < 0x3000000000000) {
            if (uVar20 == 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D((StratifiedSampler *)(uVar23 & 0xffffffffffff));
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       RandomSampler::Get2D((RandomSampler *)(uVar23 & 0xffffffffffff));
            }
          }
          else {
            pHVar27 = (HaltonSampler *)(uVar23 & 0xffffffffffff);
            if ((uVar20 & 6) == 2) {
              iVar21 = pHVar27->dimension;
              if (0x3e6 < pHVar27->dimension) {
                iVar21 = 2;
              }
              pHVar27->dimension = iVar21 + 2;
              local_4d8 = HaltonSampler::SampleDimension(pHVar27,iVar21);
              auVar44._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar21 + 1);
              auVar44._4_60_ = extraout_var_03;
              auVar29 = auVar44._0_16_;
              fStack_4d4 = (float)extraout_XMM0_Db_03;
              fStack_4d0 = (float)extraout_XMM0_Dc_03;
              fStack_4cc = (float)extraout_XMM0_Dd_03;
LAB_003c195d:
              auVar12._4_4_ = fStack_4d4;
              auVar12._0_4_ = local_4d8;
              auVar12._8_4_ = fStack_4d0;
              auVar12._12_4_ = fStack_4cc;
              auVar29 = vinsertps_avx(auVar12,auVar29,0x10);
              TVar33 = auVar29._0_8_;
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar27);
            }
          }
        }
        else {
          uVar24 = uVar11 - 4;
          if (uVar24 < 3) {
            if (uVar24 == 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       ZSobolSampler::Get2D((ZSobolSampler *)(uVar23 & 0xffffffffffff));
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       SobolSampler::Get2D((SobolSampler *)(uVar23 & 0xffffffffffff));
            }
          }
          else {
            pDVar28 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
            if (uVar20 - 6 < 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar28)
              ;
            }
            else {
              if (uVar20 - 6 != 2) {
                local_4d8 = DebugMLTSampler::Get1D(pDVar28);
                auVar45._0_4_ = DebugMLTSampler::Get1D(pDVar28);
                auVar45._4_60_ = extraout_var_04;
                auVar29 = auVar45._0_16_;
                fStack_4d4 = (float)extraout_XMM0_Db_04;
                fStack_4d0 = (float)extraout_XMM0_Dc_04;
                fStack_4cc = (float)extraout_XMM0_Dd_04;
                goto LAB_003c195d;
              }
              TVar33 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar28);
            }
          }
        }
        CameraHandle::SampleWi
                  ((optional<pbrt::CameraWiSample> *)local_198,this_00,(Interaction *)local_2f8,
                   (Point2f)TVar33,&local_478);
        if ((local_d0 == true) && ((afStack_190[5] != 0.0 || (NAN(afStack_190[5]))))) {
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y = afStack_190[3];
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = afStack_190[2];
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = afStack_190[4];
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar18;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar50;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar17;
          auVar56 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
          auVar49 = ZEXT856(0);
          SVar57 = BSDF::f(&local_68,woRender,wiRender,Importance);
          auVar55._0_8_ = SVar57.values.values._8_8_;
          auVar55._8_56_ = auVar56;
          auVar46._0_8_ = SVar57.values.values._0_8_;
          auVar46._8_56_ = auVar49;
          if (local_d0 == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
          }
          auVar29 = vmovlhps_avx(auVar46._0_16_,auVar55._0_16_);
          auVar30 = vfmadd132ss_fma(ZEXT416((uint)local_280.pi.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                                    ,ZEXT416((uint)(local_280.pi.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                                   * afStack_190[4])),ZEXT416((uint)afStack_190[3]))
          ;
          auVar36 = vfmsub213ss_fma(ZEXT416((uint)afStack_190[4]),
                                    ZEXT416((uint)local_280.pi.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                                    ZEXT416((uint)(local_280.pi.super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                                  * afStack_190[4])));
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ + auVar36._0_4_)),
                                    ZEXT416((uint)local_280.pi.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low),
                                    ZEXT416((uint)afStack_190[2]));
          uVar50 = auVar30._0_4_;
          auVar52._4_4_ = uVar50;
          auVar52._0_4_ = uVar50;
          auVar52._8_4_ = uVar50;
          auVar52._12_4_ = uVar50;
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar30 = vandps_avx512vl(auVar52,auVar8);
          auVar35._0_4_ =
               auVar30._0_4_ * auVar29._0_4_ * (float)local_428._0_4_ * (float)local_198._0_4_;
          auVar35._4_4_ =
               auVar30._4_4_ * auVar29._4_4_ * (float)local_428._4_4_ * (float)local_198._4_4_;
          auVar35._8_4_ = auVar30._8_4_ * auVar29._8_4_ * fStack_420 * afStack_190[0];
          auVar35._12_4_ = auVar30._12_4_ * auVar29._12_4_ * fStack_41c * afStack_190[1];
          auVar15._8_4_ = local_478.pdf.values[2];
          auVar15._12_4_ = local_478.pdf.values[3];
          auVar15._0_4_ = local_478.pdf.values[0];
          auVar15._4_4_ = local_478.pdf.values[1];
          auVar9._4_4_ = afStack_190[5];
          auVar9._0_4_ = afStack_190[5];
          auVar9._8_4_ = afStack_190[5];
          auVar9._12_4_ = afStack_190[5];
          auVar29 = vdivps_avx512vl(auVar35,auVar9);
          uVar23 = vcmpps_avx512vl(auVar15,_DAT_00443010,4);
          auVar29 = vdivps_avx512vl(auVar29,auVar15);
          fVar1 = (float)((uint)((byte)uVar23 & 1) * auVar29._0_4_);
          fVar2 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar29._4_4_);
          fVar3 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar29._8_4_);
          fVar32 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar29._12_4_);
          local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = fVar2;
          local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = fVar1;
          local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
          local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = fVar32;
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            uVar23 = 0xffffffffffffffff;
            do {
              if (uVar23 == 2) goto LAB_003c1b44;
              fVar6 = (&local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z)[uVar23];
              uVar23 = uVar23 + 1;
            } while ((fVar6 == 0.0) && (!NAN(fVar6)));
            if (2 < uVar23) goto LAB_003c1b44;
          }
          bVar19 = Integrator::Unoccluded((Integrator *)this,&local_170,&local_120);
          if (bVar19) {
            local_458._0_8_ =
                 *(undefined8 *)
                  (((this_00->
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    ).bits & 0xffffffffffff) + 0x340);
            if (local_d0 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
            }
            auVar13._8_4_ = fVar3;
            auVar13._0_8_ = CONCAT44(fVar2,fVar1);
            auVar13._12_4_ = fVar32;
            auVar29 = vshufpd_avx(auVar13,auVar13,1);
            v.values.values._8_8_ = auVar29._0_8_;
            v.values.values[0] = fVar1;
            v.values.values[1] = fVar2;
            FilmHandle::AddSplat((FilmHandle *)&local_458.__align,&local_178,v,&local_478);
          }
        }
LAB_003c1b44:
        local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
             (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        FVar31 = DispatchSplit<9>::operator()
                           ((DispatchSplit<9> *)&local_458,&local_c8,
                            (ulong)local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ >>
                            0x30);
        uVar23 = (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        uVar11 = (ushort)(uVar23 >> 0x30);
        uVar20 = (uint)uVar11;
        if (uVar23 < 0x5000000000000) {
          if (uVar23 < 0x3000000000000) {
            if (uVar20 == 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D((StratifiedSampler *)(uVar23 & 0xffffffffffff));
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       RandomSampler::Get2D((RandomSampler *)(uVar23 & 0xffffffffffff));
            }
          }
          else {
            pHVar27 = (HaltonSampler *)(uVar23 & 0xffffffffffff);
            if ((uVar20 & 6) == 2) {
              iVar21 = pHVar27->dimension;
              if (0x3e6 < pHVar27->dimension) {
                iVar21 = 2;
              }
              pHVar27->dimension = iVar21 + 2;
              local_488 = HaltonSampler::SampleDimension(pHVar27,iVar21);
              uStack_484 = extraout_XMM0_Db_05;
              uStack_480 = extraout_XMM0_Dc_05;
              uStack_47c = extraout_XMM0_Dd_05;
              auVar47._0_4_ = HaltonSampler::SampleDimension(pHVar27,iVar21 + 1);
              auVar47._4_60_ = extraout_var_05;
              auVar29 = auVar47._0_16_;
LAB_003c1e6f:
              auVar14._4_4_ = uStack_484;
              auVar14._0_4_ = local_488;
              auVar14._8_4_ = uStack_480;
              auVar14._12_4_ = uStack_47c;
              auVar29 = vinsertps_avx(auVar14,auVar29,0x10);
              TVar33 = auVar29._0_8_;
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar27);
            }
          }
        }
        else {
          uVar24 = uVar11 - 4;
          if (uVar24 < 3) {
            if (uVar24 == 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       ZSobolSampler::Get2D((ZSobolSampler *)(uVar23 & 0xffffffffffff));
            }
            else {
              TVar33 = (Tuple2<pbrt::Point2,_float>)
                       SobolSampler::Get2D((SobolSampler *)(uVar23 & 0xffffffffffff));
            }
          }
          else {
            pDVar28 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
            if (uVar20 - 6 < 2) {
              TVar33 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar28)
              ;
            }
            else {
              if (uVar20 - 6 != 2) {
                local_488 = DebugMLTSampler::Get1D(pDVar28);
                uStack_484 = extraout_XMM0_Db_06;
                uStack_480 = extraout_XMM0_Dc_06;
                uStack_47c = extraout_XMM0_Dd_06;
                auVar48._0_4_ = DebugMLTSampler::Get1D(pDVar28);
                auVar48._4_60_ = extraout_var_06;
                auVar29 = auVar48._0_16_;
                goto LAB_003c1e6f;
              }
              TVar33 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar28);
            }
          }
        }
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar18;
        BSDF::Sample_f((optional<pbrt::BSDFSample> *)&local_458.__align,&local_68,woRender_00,FVar31
                       ,(Point2f)TVar33,Importance,All);
        FVar31 = local_280.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
        bVar25 = local_42c;
        if (local_42c != 0) {
          local_490 = (uint)local_280.pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
          auVar36 = ZEXT416((uint)local_458._16_4_);
          local_48c = local_458._20_4_;
          local_494 = local_280.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
          local_4d8 = (Float)local_458._0_8_;
          fStack_4d4 = (float)((ulong)local_458._0_8_ >> 0x20);
          fStack_4d0 = (float)local_458._8_8_;
          fStack_4cc = (float)((ulong)local_458._8_8_ >> 0x20);
          local_488 = (Float)local_458._28_4_;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_458._20_4_;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_458._16_4_;
          local_498 = (float)local_458._24_4_;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_458._24_4_;
          SurfaceInteraction::SpawnRay
                    (&local_c8,(SurfaceInteraction *)local_2f8,&local_358,&local_68,wi_00,
                     local_458._32_4_,(Float)local_458._36_4_);
          auVar29 = vfmadd132ss_fma(ZEXT416(local_48c),ZEXT416((uint)(local_494 * local_498)),
                                    ZEXT416(local_490));
          auVar30 = vfmsub213ss_fma(ZEXT416((uint)local_498),ZEXT416((uint)local_494),
                                    ZEXT416((uint)(local_494 * local_498)));
          auVar29 = vfmadd132ss_fma(auVar36,ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                    ZEXT416((uint)FVar31));
          uVar50 = auVar29._0_4_;
          auVar37._4_4_ = uVar50;
          auVar37._0_4_ = uVar50;
          auVar37._8_4_ = uVar50;
          auVar37._12_4_ = uVar50;
          auVar10._8_4_ = 0x7fffffff;
          auVar10._0_8_ = 0x7fffffff7fffffff;
          auVar10._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx512vl(auVar37,auVar10);
          auVar53._4_4_ = local_488;
          auVar53._0_4_ = local_488;
          auVar53._8_4_ = local_488;
          auVar53._12_4_ = local_488;
          auVar38._0_4_ = auVar29._0_4_ * local_4d8;
          auVar38._4_4_ = auVar29._4_4_ * fStack_4d4;
          auVar38._8_4_ = auVar29._8_4_ * fStack_4d0;
          auVar38._12_4_ = auVar29._12_4_ * fStack_4cc;
          auVar29 = vdivps_avx(auVar38,auVar53);
          local_428._4_4_ = auVar29._4_4_ * (float)local_428._4_4_;
          local_428._0_4_ = auVar29._0_4_ * (float)local_428._0_4_;
          fStack_420 = auVar29._8_4_ * fStack_420;
          fStack_41c = auVar29._12_4_ * fStack_41c;
          local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
               local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_358.super_Ray.time = local_c8.super_Ray.time;
          local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
               local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
               local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          local_358.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
               local_c8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          local_358.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x =
               local_c8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
          local_358.super_Ray.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = local_c8.super_Ray.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
          local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
               local_c8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
          local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
               local_c8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
          local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x =
               local_c8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x;
          local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
               local_c8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y;
          local_358.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
               local_c8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
          local_358._40_4_ = local_c8._40_4_;
          local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
               local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
          local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
               local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
          local_358.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
               local_c8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
          local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x =
               local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
          local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
               local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
          local_358.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
               local_c8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
          local_358.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x =
               local_c8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
        }
        bVar25 = bVar25 ^ 1;
      }
    }
    if (bVar25 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void LightPathIntegrator::EvaluatePixelSample(Point2i pPixel, int sampleIndex,
                                              SamplerHandle sampler,
                                              ScratchBuffer &scratchBuffer) {
    // Sample wavelengths for the ray
    Float lu = sampler.Get1D();
    if (Options->disableWavelengthJitter)
        lu = 0.5;
    SampledWavelengths lambda = camera.GetFilm().SampleWavelengths(lu);

    // Sample light to start light path
    pstd::optional<SampledLight> sampledLight = lightSampler->Sample(sampler.Get1D());
    if (!sampledLight)
        return;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;

    // Sample point on light source for light path
    Float time = camera.SampleTime(sampler.Get1D());
    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return;

    // Add contribution of directly-visible light source
    if (les->intr) {
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(*les->intr, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            if (Float pdf = light.PDF_Li(cs->pLens, cs->wi); pdf > 0) {
                // Add light's emitted radiance if non-zero and light is visible
                SampledSpectrum Le =
                    light.L(les->intr->p(), les->intr->n, les->intr->uv, cs->wi, lambda);
                if (Le && Unoccluded(cs->pRef, cs->pLens)) {
                    // Compute visible light's path contribution and add to film
                    SampledSpectrum L = Le * les->AbsCosTheta(cs->wi) * cs->Wi /
                                        (lightPDF * pdf * cs->pdf);
                    L = SafeDiv(L, lambda.PDF());
                    camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
                }
            }
        }
    }

    // Follow light path and accumulate contributions to image
    int depth = 0;
    // Initialize light path ray and weighted path throughput _beta_
    RayDifferential ray(les->ray);
    SampledSpectrum beta =
        les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfPos * les->pdfDir);

    while (true) {
        // Intersect light path ray with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si)
            break;
        SurfaceInteraction &isect = si->intr;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Splat contribution into film if intersection point is visible to camera
        Vector3f wo = isect.wo;
        pstd::optional<CameraWiSample> cs =
            camera.SampleWi(isect, sampler.Get2D(), lambda);
        if (cs && cs->pdf != 0) {
            SampledSpectrum L = beta * bsdf.f(wo, cs->wi, TransportMode::Importance) *
                                AbsDot(cs->wi, isect.shading.n) * cs->Wi / cs->pdf;
            L = SafeDiv(L, lambda.PDF());
            if (L && Unoccluded(cs->pRef, cs->pLens))
                camera.GetFilm().AddSplat(cs->pRaster, L, lambda);
        }

        // Sample BSDF and update light path state
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs =
            bsdf.Sample_f(wo, u, sampler.Get2D(), TransportMode::Importance);
        if (!bs)
            break;
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);
    }
}